

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiekeypath.cpp
# Opt level: O2

bool __thiscall LOTKeyPath::fullyResolvesTo(LOTKeyPath *this,string *key,uint32_t depth)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = (ulong)depth;
  uVar7 = (long)(this->mKeys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mKeys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar6 <= uVar7) {
    uVar7 = uVar7 - 1;
    bVar2 = isGlobstar(this,depth);
    if (bVar2) {
      if (uVar7 == uVar6) {
        return true;
      }
      uVar7 = (ulong)(depth + 1);
      _Var3 = std::operator==((this->mKeys).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar7,key);
      pbVar1 = (this->mKeys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(this->mKeys).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
      if (_Var3) {
        if (lVar5 - 2U == uVar6) {
          return true;
        }
        if (lVar5 - 3U == uVar6) {
          bVar2 = endsWithGlobstar(this);
          return bVar2;
        }
      }
      else if (lVar5 - 1U <= uVar7) {
        _Var3 = std::operator==(pbVar1 + uVar7,key);
        return _Var3;
      }
    }
    else {
      _Var3 = std::operator==((this->mKeys).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar6,key);
      bVar2 = true;
      if (!_Var3) {
        bVar2 = isGlob(this,depth);
      }
      if (uVar7 == uVar6) {
        return bVar2;
      }
      if ((((long)(this->mKeys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mKeys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 2U == uVar6) &&
         (bVar4 = endsWithGlobstar(this), bVar4)) {
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool LOTKeyPath::fullyResolvesTo(const std::string key, uint32_t depth)
{
    if (depth > mKeys.size()) {
        return false;
    }

    bool isLastDepth = (depth == size());

    if (!isGlobstar(depth)) {
        bool matches = (mKeys[depth] == key) || isGlob(depth);
        return (isLastDepth || (depth == size() - 1 && endsWithGlobstar())) &&
               matches;
    }

    bool isGlobstarButNextKeyMatches = !isLastDepth && mKeys[depth + 1] == key;
    if (isGlobstarButNextKeyMatches) {
        return depth == size() - 1 ||
               (depth == size() - 2 && endsWithGlobstar());
    }

    if (isLastDepth) {
        return true;
    }

    if (depth + 1 < size()) {
        // We are a globstar but there is more than 1 key after the globstar we
        // we can't fully match.
        return false;
    }
    // Return whether the next key (which we now know is the last one) is the
    // same as the current key.
    return mKeys[depth + 1] == key;
}